

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorMalloc_Test::testBody
          (TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorMalloc_Test *this)

{
  bool bVar1;
  void *buffer;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  char *memory;
  TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorMalloc_Test *this_local;
  
  MemoryLeakWarningPlugin::setGlobalDetector
            (&((this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).
              dummyDetector)->super_MemoryLeakDetector,
             (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).dummyReporter
            );
  MemoryLeakWarningPlugin::restoreNewDeleteOverloads();
  crash_on_allocation_number(1);
  buffer = cpputest_malloc(10);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = cpputestHasCrashed;
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(bVar1 & 1),"CHECK","cpputestHasCrashed",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x132,pTVar3);
  cpputest_free(buffer);
  MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();
  return;
}

Assistant:

TEST(MemoryLeakWarningGlobalDetectorTest, crashOnLeakWithOperatorMalloc)
{
    MemoryLeakWarningPlugin::setGlobalDetector(dummyDetector, dummyReporter);

    MemoryLeakWarningPlugin::restoreNewDeleteOverloads();

    crash_on_allocation_number(1);
    char* memory = (char*) cpputest_malloc(10);
    CHECK(cpputestHasCrashed);
    cpputest_free(memory);

    MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();
}